

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

InsertOrderedSet<wasm::Name> * __thiscall
wasm::InsertOrderedSet<wasm::Name>::operator=
          (InsertOrderedSet<wasm::Name> *this,InsertOrderedSet<wasm::Name> *other)

{
  _List_node_base *p_Var1;
  undefined1 auStack_38 [8];
  Name i;
  
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<wasm::Name>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  std::__cxx11::list<wasm::Name,_std::allocator<wasm::Name>_>::clear(&this->List);
  p_Var1 = (other->List).super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&other->List) {
    do {
      auStack_38 = (undefined1  [8])p_Var1[1]._M_next;
      i.super_IString.str._M_len = (size_t)p_Var1[1]._M_prev;
      insert(this,(Name *)auStack_38);
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&other->List);
  }
  return this;
}

Assistant:

InsertOrderedSet& operator=(const InsertOrderedSet& other) {
    clear();
    for (auto i : other.List) {
      insert(i); // inserting manually creates proper iterators
    }
    return *this;
  }